

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::X
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this,
          TPZVec<Fad<double>_> *coordinate,TPZVec<Fad<double>_> *result)

{
  long *in_RDX;
  TPZFNMatrix<54,_double> cornerco;
  TPZVec<Fad<double>_> *in_stack_00001a18;
  TPZVec<Fad<double>_> *in_stack_00001a20;
  TPZFMatrix<double> *in_stack_00001a28;
  TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *in_stack_00001a30;
  int64_t in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *in_stack_fffffffffffffda0;
  
  (**(code **)(*in_RDX + 0x18))();
  TPZFNMatrix<54,_double>::TPZFNMatrix
            ((TPZFNMatrix<54,_double> *)in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98
             ,in_stack_fffffffffffffd90);
  CornerCoordinates(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::X<Fad<double>>
            (in_stack_00001a30,in_stack_00001a28,in_stack_00001a20,in_stack_00001a18);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x16fb65e);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::X(TPZVec<Fad<REAL> > &coordinate,TPZVec<Fad<REAL> > &result) const {
    result.Resize(3);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.X(cornerco,coordinate,result);
}